

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

_Bool uit_progress(mdl_t *mdl,uint32_t it,double obj)

{
  uint in_ESI;
  mdl_t *in_RDI;
  char *pcVar1;
  char *in_XMM0_Qa;
  char *msg;
  uint32_t i;
  double emax;
  double emin;
  _Bool res;
  double tm;
  tms_t now;
  uint64_t f;
  uint64_t act;
  double se;
  double te;
  double local_88;
  double local_80;
  uint local_74;
  double local_70;
  double local_68;
  bool local_59;
  timeval local_50;
  ulong local_40;
  long local_38;
  double local_30;
  char *local_28;
  char *local_20;
  uint local_14;
  mdl_t *local_10;
  bool local_1;
  
  local_20 = in_XMM0_Qa;
  local_14 = in_ESI;
  local_10 = in_RDI;
  tag_eval(in_RDI,(double *)&local_28,&local_30);
  local_38 = 0;
  for (local_40 = 0; local_40 < local_10->nftr; local_40 = local_40 + 1) {
    if ((local_10->theta[local_40] != 0.0) || (NAN(local_10->theta[local_40]))) {
      local_38 = local_38 + 1;
    }
  }
  gettimeofday(&local_50,(__timezone_ptr_t)0x0);
  msg = (char *)(((double)local_50.tv_usec * 1e-06 + (double)local_50.tv_sec) -
                ((double)(local_10->timer).tv_usec * 1e-06 + (double)(local_10->timer).tv_sec));
  local_10->total = (double)msg + local_10->total;
  (local_10->timer).tv_sec = local_50.tv_sec;
  (local_10->timer).tv_usec = local_50.tv_usec;
  info("  [%4u]",(ulong)local_14);
  pcVar1 = " obj=NA";
  if (0.0 <= (double)local_20) {
    pcVar1 = " obj=%-10.2f";
  }
  info(local_20,pcVar1);
  info(" act=%-8lu",local_38);
  info(local_28,local_30," err=%5.2f%%/%5.2f%%");
  info(msg,local_10->total," time=%.2fs/%.2fs");
  info("\n");
  local_59 = true;
  if (local_10->opt->stopwin != 0) {
    local_10->werr[local_10->wpos] = (double)local_28;
    local_10->wpos = (local_10->wpos + 1) % local_10->opt->stopwin;
    local_10->wcnt = local_10->wcnt + 1;
    if (local_10->opt->stopwin <= local_10->wcnt) {
      local_68 = 200.0;
      local_70 = -100.0;
      for (local_74 = 0; local_74 < local_10->opt->stopwin; local_74 = local_74 + 1) {
        if (local_10->werr[local_74] <= local_68) {
          local_80 = local_10->werr[local_74];
        }
        else {
          local_80 = local_68;
        }
        local_68 = local_80;
        if (local_10->werr[local_74] <= local_70) {
          local_88 = local_70;
        }
        else {
          local_88 = local_10->werr[local_74];
        }
        local_70 = local_88;
      }
      local_59 = local_10->opt->stopeps <= local_70 - local_68;
    }
  }
  if ((uit_stop & 1U) == 0) {
    local_1 = local_59;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool uit_progress(mdl_t *mdl, uint32_t it, double obj) {
	// First we just compute the error rate on devel or train data
	double te, se;
	tag_eval(mdl, &te, &se);
	// Next, we compute the number of active features
	uint64_t act = 0;
	for (uint64_t f = 0; f < mdl->nftr; f++)
		if (mdl->theta[f] != 0.0)
			act++;
	// Compute timings. As some training algorithms are multi-threaded, we
	// cannot use ansi/c function and must rely on posix one to sum time
	// spent in main thread and in child ones.
	tms_t now; gettimeofday(&now, NULL);
	double tm = (now.tv_sec        + (double)now.tv_usec        * 1.0e-6)
	          - (mdl->timer.tv_sec + (double)mdl->timer.tv_usec * 1.0e-6);
	mdl->total += tm;
	mdl->timer  = now;
	// And display progress report
	info("  [%4"PRIu32"]", it);
	info(obj >= 0.0 ? " obj=%-10.2f" : " obj=NA", obj);
	info(" act=%-8"PRIu64, act);
	info(" err=%5.2f%%/%5.2f%%", te, se);
	info(" time=%.2fs/%.2fs", tm, mdl->total);
	info("\n");
	// If requested, check the error rate stoping criterion. We check if the
	// error rate is stable enought over a few iterations.
	bool res = true;
	if (mdl->opt->stopwin != 0) {
		mdl->werr[mdl->wpos] = te;
		mdl->wpos = (mdl->wpos + 1) % mdl->opt->stopwin;
		mdl->wcnt++;
		if (mdl->wcnt >= mdl->opt->stopwin) {
			double emin = 200.0, emax = -100.0;
			for (uint32_t i = 0; i < mdl->opt->stopwin; i++) {
				emin = min(emin, mdl->werr[i]);
				emax = max(emax, mdl->werr[i]);
			}
			if (emax - emin < mdl->opt->stopeps)
				res = false;
		}
	}
	// And return
	if (uit_stop)
		return false;
	return res;
}